

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::EnumValBuilder::AssignEnumeratorValue(EnumValBuilder *this,string *value)

{
  char *pcVar1;
  char *str;
  string *msg;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  uint64_t u64;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (value->field_2)._M_local_buf[8] = '\x01';
  if (*(int *)(value->_M_string_length + 0xd0) == 10) {
    str = (in_RDX->_M_dataplus)._M_p;
    bVar3 = false;
    bVar2 = StringToIntegerImpl<unsigned_long>((unsigned_long *)&local_68,str,0,true);
    if ((bVar2) && (bVar3 = true, local_68 != (long *)0x0)) {
      pcVar4 = str + -1;
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
        if (*pcVar1 == '\0') break;
      } while (9 < (int)*pcVar1 - 0x30U);
      if (pcVar4[-(ulong)(str < pcVar4)] == '-') {
        local_68 = (long *)0xffffffffffffffff;
        bVar3 = false;
      }
    }
  }
  else {
    bVar3 = StringToIntegerImpl<long>((long *)&local_68,(in_RDX->_M_dataplus)._M_p,0,true);
  }
  *(long **)((value->field_2)._M_allocated_capacity + 0xa0) = local_68;
  if (bVar3 == false) {
    msg = (string *)(value->_M_dataplus)._M_p;
    std::operator+(&local_48,"enum value does not fit, \"",in_RDX);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_58 = *plVar6;
      lStack_50 = plVar5[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar6;
      local_68 = (long *)*plVar5;
    }
    local_60 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Parser::Error((Parser *)this,msg);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined2 *)&this->parser = 0;
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR AssignEnumeratorValue(const std::string &value) {
    user_value = true;
    auto fit = false;
    if (enum_def.IsUInt64()) {
      uint64_t u64;
      fit = StringToNumber(value.c_str(), &u64);
      temp->value = static_cast<int64_t>(u64);  // well-defined since C++20.
    } else {
      int64_t i64;
      fit = StringToNumber(value.c_str(), &i64);
      temp->value = i64;
    }
    if (!fit) return parser.Error("enum value does not fit, \"" + value + "\"");
    return NoError();
  }